

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCollapsingSortedStoragesList.hpp
# Opt level: O2

void __thiscall
supermap::
BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>
::append(BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>
         *this,unique_ptr<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
               *storage)

{
  shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode>
  *this_00;
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
  *this_01;
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_>_>_()>
  *this_02;
  _Head_base<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_*,_false>
  _Var1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  long lVar4;
  initializer_list<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>
  __l;
  allocator<char> local_17a;
  allocator_type local_179;
  shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode>
  nextNode;
  shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode>
  curNode;
  undefined1 local_140 [72];
  string local_f8;
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>
  local_d8;
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>
  local_a0;
  SortedStorage mergedKeys;
  
  this_00 = &this->head_;
  std::
  make_shared<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<3ul>>>,supermap::Key<3ul>>::ListNode,std::unique_ptr<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<3ul>>>,supermap::Key<3ul>>,std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<3ul>>>,supermap::Key<3ul>>>>,std::shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<3ul>>>,supermap::Key<3ul>>::ListNode>,unsigned_long&>
            ((unique_ptr<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
              *)&local_d8,
             (shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode>
              *)storage,(unsigned_long *)this_00);
  std::
  __shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
  ::operator=(&this_00->
               super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
              ,(__shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
                *)&local_d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_d8.
              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
              .
              super_IndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
              .
              super_OrderedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
              .register_);
  std::
  __shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&curNode.
                  super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
                 ,&this_00->
                   super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
                );
  std::
  __shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&nextNode.
                  super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
                 ,&((curNode.
                     super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->next).
                   super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
                );
  this_01 = (vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
             *)(local_140 + 0x10);
  this_02 = (function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_>_>_()>
             *)(local_140 + 0x28);
  while (nextNode.
         super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr != (element_type *)0x0) {
    uVar2 = ListNode::getRank(curNode.
                              super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr);
    uVar3 = ListNode::getRank(nextNode.
                              super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr);
    if (uVar2 < uVar3) break;
    SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>
    ::SortedSingleFileIndexedStorage
              (&local_d8,
               ((nextNode.
                 super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->storage)._M_t.
               super___uniq_ptr_impl<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_*,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
               .
               super__Head_base<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_*,_false>
               ._M_head_impl);
    SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>
    ::SortedSingleFileIndexedStorage
              (&local_a0,
               ((curNode.
                 super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->storage)._M_t.
               super___uniq_ptr_impl<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_*,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
               .
               super__Head_base<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_*,_false>
               ._M_head_impl);
    __l._M_len = 2;
    __l._M_array = &local_d8;
    std::
    vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
    ::vector(this_01,__l,&local_179);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"collapse",&local_17a);
    SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
    ::getFileManager((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
                      *)local_140);
    uVar2 = this->batchSize_;
    std::
    function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_>_>_()>
    ::function(this_02,&this->innerRegisterSupplier_);
    SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>
    ::SortedSingleFileIndexedStorage
              (&mergedKeys,this_01,&local_f8,(shared_ptr<supermap::io::FileManager> *)local_140,
               uVar2,this_02);
    std::_Function_base::~_Function_base((_Function_base *)this_02);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_140 + 8));
    std::__cxx11::string::~string((string *)&local_f8);
    std::
    vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
    ::~vector(this_01);
    lVar4 = 0x38;
    do {
      SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
      ::~SingleFileIndexedStorage
                ((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
                  *)((long)&local_d8.
                            super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
                            .
                            super_IndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
                            .
                            super_OrderedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
                            ._vptr_OrderedStorage + lVar4));
      lVar4 = lVar4 + -0x38;
    } while (lVar4 != -0x38);
    _Var1._M_head_impl =
         ((nextNode.
           super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr)->storage)._M_t.
         super___uniq_ptr_impl<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_*,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
         .
         super__Head_base<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_*,_false>
         ._M_head_impl;
    (**(code **)(*(long *)&(_Var1._M_head_impl)->
                           super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
                + 0x28))(_Var1._M_head_impl,&mergedKeys);
    std::
    __shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
    ::operator=(&this_00->
                 super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
                ,&nextNode.
                  super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
               );
    std::
    __shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
    ::operator=(&curNode.
                 super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
                ,&nextNode.
                  super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
               );
    std::
    __shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
    ::operator=(&nextNode.
                 super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
                ,&((nextNode.
                    super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->next).
                  super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
               );
    SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
    ::~SingleFileIndexedStorage
              (&mergedKeys.
                super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
              );
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&nextNode.
              super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&curNode.
              super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void append(std::unique_ptr<SortedStorage> &&storage) override {
        head_ = std::make_shared<ListNode>(std::move(storage), std::move(head_), batchSize_);
        std::shared_ptr<ListNode> curNode = head_;
        std::shared_ptr<ListNode> nextNode = curNode->next;
        while (nextNode != nullptr) {
            assert(curNode->getRank() <= nextNode->getRank());
            if (curNode->getRank() < nextNode->getRank()) {
                break;
            }
            assert(curNode->valid());
            assert(nextNode->valid());
            SortedStorage mergedKeys(
                std::vector<SortedStorage>{*nextNode->storage, *curNode->storage},
                "collapse",
                curNode->storage->getFileManager(),
                batchSize_,
                innerRegisterSupplier_
            );
            nextNode->storage->resetWith(std::move(mergedKeys));
            head_ = nextNode;
            curNode = nextNode;
            nextNode = nextNode->next;
        }
    }